

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O2

int bn2binpad(BIGNUM *a,uchar *to,int tolen)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  iVar1 = BN_num_bits((BIGNUM *)a);
  uVar3 = (long)(iVar1 + 7) / 8;
  uVar5 = uVar3 & 0xffffffff;
  iVar1 = (int)uVar3;
  uVar3 = uVar5;
  if (tolen != -1) {
    iVar2 = tolen - iVar1;
    if (tolen < iVar1) {
      return -1;
    }
    uVar3 = (ulong)(uint)tolen;
    if (iVar2 != 0 && iVar1 <= tolen) {
      memset(to,0,(long)iVar2);
      to = to + iVar2;
    }
  }
  while( true ) {
    uVar4 = (int)uVar5 - 1;
    uVar5 = (ulong)uVar4;
    if (uVar4 == 0xffffffff) break;
    *to = (uchar)(a->d[(int)uVar4 / 8] >> ((char)((int)uVar4 % 8) * '\b' & 0x3fU));
    to = to + 1;
  }
  return (int)uVar3;
}

Assistant:

static int bn2binpad(const BIGNUM *a, unsigned char *to, int tolen)
{
    int i;
    BN_ULONG l;

    bn_check_top(a);
    i = BN_num_bytes(a);
    if (tolen == -1)
        tolen = i;
    else if (tolen < i)
        return -1;
    /* Add leading zeroes if necessary */
    if (tolen > i) {
        memset(to, 0, tolen - i);
        to += tolen - i;
    }
    while (i--) {
        l = a->d[i / BN_BYTES];
        *(to++) = (unsigned char)(l >> (8 * (i % BN_BYTES))) & 0xff;
    }
    return tolen;
}